

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O0

void sat_solver3_delete(sat_solver3 *s)

{
  int local_14;
  int i;
  sat_solver3 *s_local;
  
  Sat_MemFree_(&s->Mem);
  veci_delete(&s->order);
  veci_delete(&s->trail_lim);
  veci_delete(&s->tagged);
  veci_delete(&s->act_clas);
  veci_delete(&s->stack);
  veci_delete(&s->act_vars);
  veci_delete(&s->unit_lits);
  veci_delete(&s->pivot_vars);
  veci_delete(&s->temp_clause);
  veci_delete(&s->conf_final);
  if (s->reasons != (int *)0x0) {
    for (local_14 = 0; SBORROW4(local_14,s->cap * 2) != local_14 + s->cap * -2 < 0;
        local_14 = local_14 + 1) {
      veci_delete(s->wlists + local_14);
    }
    if (s->wlists != (veci *)0x0) {
      free(s->wlists);
      s->wlists = (veci *)0x0;
    }
    if (s->levels != (int *)0x0) {
      free(s->levels);
      s->levels = (int *)0x0;
    }
    if (s->assigns != (char *)0x0) {
      free(s->assigns);
      s->assigns = (char *)0x0;
    }
    if (s->polarity != (char *)0x0) {
      free(s->polarity);
      s->polarity = (char *)0x0;
    }
    if (s->tags != (char *)0x0) {
      free(s->tags);
      s->tags = (char *)0x0;
    }
    if (s->loads != (char *)0x0) {
      free(s->loads);
      s->loads = (char *)0x0;
    }
    if (s->activity != (word *)0x0) {
      free(s->activity);
      s->activity = (word *)0x0;
    }
    if (s->activity2 != (word *)0x0) {
      free(s->activity2);
      s->activity2 = (word *)0x0;
    }
    if (s->pFreqs != (char *)0x0) {
      free(s->pFreqs);
      s->pFreqs = (char *)0x0;
    }
    if (s->factors != (double *)0x0) {
      free(s->factors);
      s->factors = (double *)0x0;
    }
    if (s->orderpos != (int *)0x0) {
      free(s->orderpos);
      s->orderpos = (int *)0x0;
    }
    if (s->reasons != (int *)0x0) {
      free(s->reasons);
      s->reasons = (int *)0x0;
    }
    if (s->trail != (lit *)0x0) {
      free(s->trail);
      s->trail = (lit *)0x0;
    }
    if (s->model != (int *)0x0) {
      free(s->model);
      s->model = (int *)0x0;
    }
  }
  if (s != (sat_solver3 *)0x0) {
    free(s);
  }
  return;
}

Assistant:

void sat_solver3_delete(sat_solver3* s)
{
//    Vec_SetFree_( &s->Mem );
    Sat_MemFree_( &s->Mem );

    // delete vectors
    veci_delete(&s->order);
    veci_delete(&s->trail_lim);
    veci_delete(&s->tagged);
//    veci_delete(&s->learned);
    veci_delete(&s->act_clas);
    veci_delete(&s->stack);
//    veci_delete(&s->model);
    veci_delete(&s->act_vars);
    veci_delete(&s->unit_lits);
    veci_delete(&s->pivot_vars);
    veci_delete(&s->temp_clause);
    veci_delete(&s->conf_final);

    // delete arrays
    if (s->reasons != 0){
        int i;
        for (i = 0; i < s->cap*2; i++)
            veci_delete(&s->wlists[i]);
        ABC_FREE(s->wlists   );
//        ABC_FREE(s->vi       );
        ABC_FREE(s->levels   );
        ABC_FREE(s->assigns  );
        ABC_FREE(s->polarity );
        ABC_FREE(s->tags     );
        ABC_FREE(s->loads    );
        ABC_FREE(s->activity );
        ABC_FREE(s->activity2);
        ABC_FREE(s->pFreqs   );
        ABC_FREE(s->factors  );
        ABC_FREE(s->orderpos );
        ABC_FREE(s->reasons  );
        ABC_FREE(s->trail    );
        ABC_FREE(s->model    );
    }

    ABC_FREE(s);
}